

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O2

iterator __thiscall
Common::
BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
::insert(BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,KeywordID *val
        )

{
  size_t *psVar1;
  mapped_type mVar2;
  size_t sVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
  pStack_58;
  
  sVar3 = findKey(this,key);
  sVar4 = ((long)(this->data).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->data).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  if (sVar3 == sVar4) {
    sVar3 = findValue(this,val);
    sVar4 = ((long)(this->data).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->data).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x28;
    if (sVar3 == sVar4) {
      psVar1 = (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur == psVar1) {
        mVar2 = this->currcount;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](&this->keymap,key);
        *pmVar5 = mVar2;
        mVar2 = this->currcount;
        pmVar5 = std::
                 map<ICM::Keyword::KeywordID,_unsigned_long,_std::less<ICM::Keyword::KeywordID>,_std::allocator<std::pair<const_ICM::Keyword::KeywordID,_unsigned_long>_>_>
                 ::operator[](&this->valmap,val);
        *pmVar5 = mVar2;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID,_true>
                  (&pStack_58,key,val);
        std::
        vector<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>,std::allocator<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>>>
        ::emplace_back<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>>
                  ((vector<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>,std::allocator<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>>>
                    *)&this->data,&pStack_58);
        std::__cxx11::string::~string((string *)&pStack_58);
        sVar4 = this->currcount;
        this->currcount = sVar4 + 1;
      }
      else {
        sVar4 = *psVar1;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](&this->keymap,key);
        *pmVar5 = sVar4;
        pmVar5 = std::
                 map<ICM::Keyword::KeywordID,_unsigned_long,_std::less<ICM::Keyword::KeywordID>,_std::allocator<std::pair<const_ICM::Keyword::KeywordID,_unsigned_long>_>_>
                 ::operator[](&this->valmap,val);
        *pmVar5 = sVar4;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID,_true>
                  (&pStack_58,key,val);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
        ::operator=((this->data).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + sVar4,&pStack_58);
        std::__cxx11::string::~string((string *)&pStack_58);
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&this->destroyable);
      }
    }
  }
  iVar6.count = sVar4;
  iVar6.data = this;
  return iVar6;
}

Assistant:

iterator insert(const _KTy &key, const _VTy &val) {
		if (findKey(key) != size() || findValue(val) != size()) {
			return end();
		}

		iterator result(this);
		if (destroyable.empty()) {
			keymap[key] = currcount;
			valmap[val] = currcount;
			data.push_back(std::make_pair(key, val));
			result = iterator(this, currcount);
			currcount++;
		}
		else {
			size_t id = destroyable.front();
			keymap[key] = id;
			valmap[val] = id;
			data[id] = std::make_pair(key, val);
			result = iterator(this, id);
			destroyable.pop_front();
		}
		return result;
	}